

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O3

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
DiscardResource<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Resource,Uint64 FenceValue)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  DynamicStaleResourceWrapper local_20;
  
  local_20.m_pStaleResource = (StaleResourceBase *)operator_new(0x28);
  (local_20.m_pStaleResource)->_vptr_StaleResourceBase =
       (_func_int **)&PTR__SpecificStaleResource_0091d068;
  peVar1 = (Resource->m_pManager).
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (Resource->m_pManager).
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (Resource->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20.m_pStaleResource[1]._vptr_StaleResourceBase = (_func_int **)peVar1;
  local_20.m_pStaleResource[2]._vptr_StaleResourceBase = (_func_int **)p_Var2;
  (Resource->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_20.m_pStaleResource[3]._vptr_StaleResourceBase = (_func_int **)Resource->m_VkSyncObject;
  *(bool *)&local_20.m_pStaleResource[4]._vptr_StaleResourceBase = Resource->m_IsUnsignaled;
  Resource->m_VkSyncObject = (NativeType)0x0;
  DiscardResource(this,&local_20,FenceValue);
  if (local_20.m_pStaleResource != (StaleResourceBase *)0x0) {
    (*(local_20.m_pStaleResource)->_vptr_StaleResourceBase[2])();
  }
  return;
}

Assistant:

void DiscardResource(ResourceType&& Resource, Uint64 FenceValue)
    {
        DiscardResource(CreateWrapper(std::move(Resource), 1), FenceValue);
    }